

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::logBlendState(TestLog *log,BlendState *blend)

{
  bool bVar1;
  bool *pbVar2;
  Vector<bool,_4> *v;
  uint *puVar3;
  SeparateBlendEq *pSVar4;
  BlendFunc *pBVar5;
  MessageBuilder *pMVar6;
  SeparateBlendFunc *pSVar7;
  Enum<int,_2UL> EVar8;
  Enum<int,_2UL> local_d50;
  GetNameFunc local_d40;
  int local_d38;
  Enum<int,_2UL> local_d30;
  MessageBuilder local_d20;
  GetNameFunc local_ba0;
  int local_b98;
  Enum<int,_2UL> local_b90;
  GetNameFunc local_b80;
  int local_b78;
  Enum<int,_2UL> local_b70;
  MessageBuilder local_b60;
  GetNameFunc local_9e0;
  int local_9d8;
  Enum<int,_2UL> local_9d0;
  GetNameFunc local_9c0;
  int local_9b8;
  Enum<int,_2UL> local_9b0;
  MessageBuilder local_9a0;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *local_820;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *blendFunc;
  int local_810;
  Enum<int,_2UL> local_808;
  GetNameFunc local_7f8;
  int local_7f0;
  Enum<int,_2UL> local_7e8;
  MessageBuilder local_7d8;
  GetNameFunc local_658;
  int local_650;
  Enum<int,_2UL> local_648;
  MessageBuilder local_638;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *local_4b8;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *blendEq;
  Vector<bool,_4> local_32c;
  undefined1 local_328 [4];
  BVec4 mask;
  MessageBuilder local_198;
  BlendState *local_18;
  BlendState *blend_local;
  TestLog *log_local;
  
  local_18 = blend;
  blend_local = (BlendState *)log;
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)blend);
  if (bVar1) {
    pbVar2 = tcu::Maybe<bool>::operator*(&local_18->enableBlend);
    if ((*pbVar2 & 1U) == 0) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)local_328,(TestLog *)blend_local,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_328,(char (*) [18])"Disable blending.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_328);
    }
    else {
      tcu::TestLog::operator<<
                (&local_198,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_198,(char (*) [17])"Enable blending.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_198);
    }
  }
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&local_18->colorMask);
  if (bVar1) {
    v = tcu::Maybe<tcu::Vector<bool,_4>_>::operator*(&local_18->colorMask);
    tcu::Vector<bool,_4>::Vector(&local_32c,v);
    tcu::TestLog::operator<<
              ((MessageBuilder *)&blendEq,(TestLog *)blend_local,
               (BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&blendEq,(char (*) [17])"Set color mask: ");
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_32c);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&blendEq);
  }
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&local_18->blendEq);
  if (bVar1) {
    local_4b8 = tcu::
                Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
                ::operator*(&local_18->blendEq);
    bVar1 = tcu::
            Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
            is<unsigned_int>(local_4b8);
    if (bVar1) {
      tcu::TestLog::operator<<
                (&local_638,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<(&local_638,(char (*) [21])"Set blend equation: ");
      puVar3 = tcu::
               Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
               ::get<unsigned_int>(local_4b8);
      EVar8 = glu::getBlendEquationStr(*puVar3);
      local_658 = EVar8.m_getName;
      local_650 = EVar8.m_value;
      local_648.m_getName = local_658;
      local_648.m_value = local_650;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_648);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_638);
    }
    else {
      bVar1 = tcu::
              Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(local_4b8);
      if (bVar1) {
        tcu::TestLog::operator<<
                  (&local_7d8,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_7d8,(char (*) [25])"Set blend equation rgb: ");
        pSVar4 = tcu::
                 Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(local_4b8);
        EVar8 = glu::getBlendEquationStr(pSVar4->rgb);
        local_7f8 = EVar8.m_getName;
        local_7f0 = EVar8.m_value;
        local_7e8.m_getName = local_7f8;
        local_7e8.m_value = local_7f0;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_7e8);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [10])", alpha: ");
        pSVar4 = tcu::
                 Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(local_4b8);
        EVar8 = glu::getBlendEquationStr(pSVar4->alpha);
        blendFunc = (Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                     *)EVar8.m_getName;
        local_810 = EVar8.m_value;
        local_808.m_getName = (GetNameFunc)blendFunc;
        local_808.m_value = local_810;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_808);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_7d8);
      }
    }
  }
  bVar1 = tcu::Maybe::operator_cast_to_bool((Maybe *)&local_18->blendFunc);
  if (bVar1) {
    local_820 = tcu::
                Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
                ::operator*(&local_18->blendFunc);
    bVar1 = tcu::
            Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
            ::is<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(local_820);
    if (bVar1) {
      tcu::TestLog::operator<<
                (&local_9a0,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_9a0,(char (*) [28])"Set blend function source: ");
      pBVar5 = tcu::
               Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(local_820);
      EVar8 = glu::getBlendFactorStr(pBVar5->src);
      local_9c0 = EVar8.m_getName;
      local_9b8 = EVar8.m_value;
      local_9b0.m_getName = local_9c0;
      local_9b0.m_value = local_9b8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9b0);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])", destination: ");
      pBVar5 = tcu::
               Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
               ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(local_820);
      EVar8 = glu::getBlendFactorStr(pBVar5->dst);
      local_9e0 = EVar8.m_getName;
      local_9d8 = EVar8.m_value;
      local_9d0.m_getName = local_9e0;
      local_9d0.m_value = local_9d8;
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_9d0);
      pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_9a0);
    }
    else {
      bVar1 = tcu::
              Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(local_820);
      if (bVar1) {
        tcu::TestLog::operator<<
                  (&local_b60,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_b60,(char (*) [32])"Set blend function rgb source: ");
        pSVar7 = tcu::
                 Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                           (local_820);
        EVar8 = glu::getBlendFactorStr((pSVar7->rgb).src);
        local_b80 = EVar8.m_getName;
        local_b78 = EVar8.m_value;
        local_b70.m_getName = local_b80;
        local_b70.m_value = local_b78;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b70);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])", destination: ");
        pSVar7 = tcu::
                 Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                           (local_820);
        EVar8 = glu::getBlendFactorStr((pSVar7->rgb).dst);
        local_ba0 = EVar8.m_getName;
        local_b98 = EVar8.m_value;
        local_b90.m_getName = local_ba0;
        local_b90.m_value = local_b98;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_b90);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b60);
        tcu::TestLog::operator<<
                  (&local_d20,(TestLog *)blend_local,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_d20,(char (*) [34])"Set blend function alpha source: ");
        pSVar7 = tcu::
                 Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                           (local_820);
        EVar8 = glu::getBlendFactorStr((pSVar7->alpha).src);
        local_d40 = EVar8.m_getName;
        local_d38 = EVar8.m_value;
        local_d30.m_getName = local_d40;
        local_d30.m_value = local_d38;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_d30);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [16])", destination: ");
        pSVar7 = tcu::
                 Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                 ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                           (local_820);
        EVar8 = glu::getBlendFactorStr((pSVar7->alpha).dst);
        local_d50.m_getName = EVar8.m_getName;
        local_d50.m_value = EVar8.m_value;
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_d50);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0xf5dc26);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_d20);
      }
    }
  }
  return;
}

Assistant:

void logBlendState (TestLog&			log,
					const BlendState&	blend)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			log << TestLog::Message << "Enable blending." << TestLog::EndMessage;
		else
			log << TestLog::Message << "Disable blending." << TestLog::EndMessage;
	}

	if (blend.colorMask)
	{
		const BVec4 mask = *blend.colorMask;

		log << TestLog::Message << "Set color mask: " << mask << "." << TestLog::EndMessage;
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			log << TestLog::Message << "Set blend equation: " << glu::getBlendEquationStr(blendEq.get<BlendEq>()) << "." << TestLog::EndMessage;
		else if (blendEq.is<SeparateBlendEq>())
			log << TestLog::Message << "Set blend equation rgb: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().rgb) << ", alpha: " << glu::getBlendEquationStr(blendEq.get<SeparateBlendEq>().alpha) << "." << TestLog::EndMessage;
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			log << TestLog::Message << "Set blend function source: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<BlendFunc>().dst) << "." << TestLog::EndMessage;
		else if (blendFunc.is<SeparateBlendFunc>())
		{
			log << TestLog::Message << "Set blend function rgb source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().rgb.dst) << "." << TestLog::EndMessage;
			log << TestLog::Message << "Set blend function alpha source: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.src) << ", destination: " << glu::getBlendFactorStr(blendFunc.get<SeparateBlendFunc>().alpha.dst) << "." << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);
	}
}